

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall crnlib::crn_comp::compress_internal(crn_comp *this)

{
  anon_enum_32 aVar1;
  bool bVar2;
  anon_enum_32 aVar3;
  uint uVar4;
  vector<unsigned_char> *other;
  ulong uVar5;
  vector<unsigned_short> *local_148;
  vector<unsigned_short> *local_138;
  vector<unsigned_short> *local_128;
  vector<unsigned_short> *local_118;
  symbol_codec *local_108;
  byte local_f1;
  uint local_d4;
  uint i_1;
  undefined1 local_c0 [8];
  symbol_codec codec;
  uint local_20;
  uint level;
  uint pass;
  uint i;
  crn_comp *this_local;
  
  bVar2 = alias_images(this);
  if (bVar2) {
    bVar2 = quantize_images(this);
    if (bVar2) {
      symbol_histogram::clear(&this->m_reference_hist);
      for (level = 0; level < 2; level = level + 1) {
        vector<unsigned_short>::clear(this->m_endpoint_remaping + level);
        symbol_histogram::clear(this->m_endpoint_index_hist + level);
        static_huffman_data_model::clear
                  ((static_huffman_data_model *)
                   ((long)this->m_endpoint_index_hist + (ulong)level * 0x38 + 0x20));
        vector<unsigned_short>::clear(this->m_selector_remaping + level);
        symbol_histogram::clear(this->m_selector_index_hist + level);
        static_huffman_data_model::clear
                  ((static_huffman_data_model *)
                   ((long)this->m_selector_index_hist + (ulong)level * 0x38 + 0x20));
      }
      if ((this->m_has_comp[0] & 1U) != 0) {
        optimize_color(this);
      }
      if ((this->m_has_comp[1] & 1U) != 0) {
        optimize_alpha(this);
      }
      for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
        for (codec.m_mode = cNull; aVar1 = codec.m_mode,
            aVar3 = vector<crnlib::crn_comp::level_details>::size(&this->m_levels), aVar1 < aVar3;
            codec.m_mode = codec.m_mode + cEncoding) {
          symbol_codec::symbol_codec((symbol_codec *)local_c0);
          symbol_codec::start_encoding((symbol_codec *)local_c0,0x200000);
          local_f1 = 0;
          if (local_20 == 0) {
            local_f1 = codec.m_mode != cNull ^ 0xff;
            local_108 = (symbol_codec *)0x0;
          }
          else {
            local_108 = (symbol_codec *)local_c0;
          }
          if ((this->m_has_comp[0] & 1U) == 0) {
            local_118 = (vector<unsigned_short> *)0x0;
          }
          else {
            local_118 = this->m_endpoint_remaping;
          }
          if ((this->m_has_comp[0] & 1U) == 0) {
            local_128 = (vector<unsigned_short> *)0x0;
          }
          else {
            local_128 = this->m_selector_remaping;
          }
          if ((this->m_has_comp[1] & 1U) == 0) {
            local_138 = (vector<unsigned_short> *)0x0;
          }
          else {
            local_138 = this->m_endpoint_remaping + 1;
          }
          if ((this->m_has_comp[1] & 1U) == 0) {
            local_148 = (vector<unsigned_short> *)0x0;
          }
          else {
            local_148 = this->m_selector_remaping + 1;
          }
          bVar2 = pack_blocks(this,codec.m_mode,(bool)(local_f1 & 1),local_108,local_118,local_128,
                              local_138,local_148);
          if (bVar2) {
            symbol_codec::stop_encoding((symbol_codec *)local_c0,false);
            if (local_20 != 0) {
              uVar5 = (ulong)codec.m_mode;
              other = symbol_codec::get_encoding_buf((symbol_codec *)local_c0);
              vector<unsigned_char>::swap(this->m_packed_blocks + uVar5,other);
            }
            bVar2 = false;
          }
          else {
            this_local._7_1_ = 0;
            bVar2 = true;
          }
          symbol_codec::~symbol_codec((symbol_codec *)local_c0);
          if (bVar2) goto LAB_001b8bc7;
        }
        if (local_20 == 0) {
          static_huffman_data_model::init(&this->m_reference_dm,(EVP_PKEY_CTX *)0x1);
          for (local_d4 = 0; local_d4 < 2; local_d4 = local_d4 + 1) {
            uVar4 = symbol_histogram::size(this->m_endpoint_index_hist + local_d4);
            if (uVar4 != 0) {
              static_huffman_data_model::init
                        ((static_huffman_data_model *)
                         ((long)this->m_endpoint_index_hist + (ulong)local_d4 * 0x38 + 0x20),
                         (EVP_PKEY_CTX *)0x1);
            }
            uVar4 = symbol_histogram::size(this->m_selector_index_hist + local_d4);
            if (uVar4 != 0) {
              static_huffman_data_model::init
                        ((static_huffman_data_model *)
                         ((long)this->m_selector_index_hist + (ulong)local_d4 * 0x38 + 0x20),
                         (EVP_PKEY_CTX *)0x1);
            }
          }
        }
      }
      bVar2 = pack_data_models(this);
      if (bVar2) {
        bVar2 = create_comp_data(this);
        if (bVar2) {
          bVar2 = update_progress(this,0x18,1,1);
          if (bVar2) {
            if ((this->m_pParams->m_flags & 0x80000000) != 0) {
              crnlib_print_mem_stats();
            }
            this_local._7_1_ = 1;
          }
          else {
            this_local._7_1_ = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_001b8bc7:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool crn_comp::compress_internal()
    {
        if (!alias_images())
        {
            return false;
        }
        if (!quantize_images())
        {
            return false;
        }

        m_reference_hist.clear();
        for (uint i = 0; i < 2; i++)
        {
            m_endpoint_remaping[i].clear();
            m_endpoint_index_hist[i].clear();
            m_endpoint_index_dm[i].clear();
            m_selector_remaping[i].clear();
            m_selector_index_hist[i].clear();
            m_selector_index_dm[i].clear();
        }

        if (m_has_comp[cColor])
        {
            optimize_color();
        }

        if (m_has_comp[cAlpha0])
        {
            optimize_alpha();
        }

        for (uint pass = 0; pass < 2; pass++)
        {
            for (uint level = 0; level < m_levels.size(); level++)
            {
                symbol_codec codec;
                codec.start_encoding(2 * 1024 * 1024);

                if (!pack_blocks(
                        level,
                        !pass && !level, pass ? &codec : nullptr,
                        m_has_comp[cColor] ? &m_endpoint_remaping[cColor] : nullptr, m_has_comp[cColor] ? &m_selector_remaping[cColor] : nullptr,
                        m_has_comp[cAlpha0] ? &m_endpoint_remaping[cAlpha0] : nullptr, m_has_comp[cAlpha0] ? &m_selector_remaping[cAlpha0] : nullptr))
                {
                    return false;
                }

                codec.stop_encoding(false);

                if (pass)
                {
                    m_packed_blocks[level].swap(codec.get_encoding_buf());
                }
            }

            if (!pass)
            {
                m_reference_dm.init(true, m_reference_hist, 16);

                for (uint i = 0; i < 2; i++)
                {
                    if (m_endpoint_index_hist[i].size())
                    {
                        m_endpoint_index_dm[i].init(true, m_endpoint_index_hist[i], 16);
                    }

                    if (m_selector_index_hist[i].size())
                    {
                        m_selector_index_dm[i].init(true, m_selector_index_hist[i], 16);
                    }
                }
            }
        }

        if (!pack_data_models())
        {
            return false;
        }

        if (!create_comp_data())
        {
            return false;
        }

        if (!update_progress(24, 1, 1))
        {
            return false;
        }

        if (m_pParams->m_flags & cCRNCompFlagDebugging)
        {
            crnlib_print_mem_stats();
        }

        return true;
    }